

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageTemplate.cpp
# Opt level: O0

void __thiscall
ki::protocol::dml::MessageTemplate::MessageTemplate
          (MessageTemplate *this,string *name,uint8_t type,uint8_t service_id,Record *record)

{
  Record *record_local;
  uint8_t service_id_local;
  uint8_t type_local;
  string *name_local;
  MessageTemplate *this_local;
  
  std::__cxx11::string::string((string *)this);
  std::__cxx11::string::operator=((string *)this,(string *)name);
  this->m_type = type;
  this->m_service_id = service_id;
  this->m_record = record;
  return;
}

Assistant:

MessageTemplate::MessageTemplate(std::string name, uint8_t type,
		uint8_t service_id, ki::dml::Record* record)
	{
		m_name = name;
		m_type = type;
		m_service_id = service_id;
		m_record = record;
	}